

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void __thiscall FMapInfoParser::ParseNextMap(FMapInfoParser *this,FString *mapname)

{
  bool bVar1;
  char *fmt;
  FName seq;
  int local_1c;
  
  bVar1 = FScanner::CheckNumber(&this->sc);
  if (bVar1) {
    if (this->HexenHack == true) {
      fmt = "&wt@%02d";
    }
    else {
      fmt = "MAP%02d";
    }
    FString::Format(mapname,fmt,(ulong)(uint)(this->sc).Number);
    return;
  }
  FScanner::MustGetString(&this->sc);
  FString::operator=(mapname,(this->sc).String);
  CheckEndSequence((FMapInfoParser *)&stack0xffffffffffffffe4);
  if (local_1c != 0) {
    FString::Format(mapname,"enDSeQ%04x");
  }
  return;
}

Assistant:

void FMapInfoParser::ParseNextMap(FString &mapname)
{
	if (sc.CheckNumber())
	{
		if (HexenHack)
		{
			mapname.Format("&wt@%02d", sc.Number);
		}
		else
		{
			mapname.Format("MAP%02d", sc.Number);
		}
	}
	else
	{
		sc.MustGetString();
		mapname = sc.String;
		FName seq = CheckEndSequence();
		if (seq != NAME_None)
		{
			mapname.Format("enDSeQ%04x", int(seq));
		}
	}
}